

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flex-estimation-test.cpp
# Opt level: O1

int testConstant(void)

{
  undefined1 auVar1 [16];
  double dVar2;
  uint uVar3;
  ostream *poVar4;
  PointerType pdVar5;
  long *plVar6;
  undefined8 *puVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  double *pdVar11;
  long lVar12;
  uint i;
  uint uVar13;
  ulong uVar14;
  Matrix<double,__1,__1,_0,__1,__1> *pMVar15;
  Matrix<double,_4,_4,_0,_4,_4> *pMVar16;
  byte bVar17;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar18;
  undefined4 uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  Vector v2;
  Matrix3 rt;
  IndexedMatrixArray xh;
  Vector uConstant;
  Vector yConstant;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  contactPositions;
  Vector3 contact;
  Matrix3 res;
  Vector xh0;
  Matrix4 m;
  Matrix4 m2;
  IndexedMatrixArray u;
  IndexedMatrixArray y;
  ofstream f;
  assign_op<double,_double> local_6f9;
  PointerType local_6f8;
  double dStack_6f0;
  double local_6e0;
  Matrix<double,_3,_3,_0,_3,_3> local_6d8;
  uint local_690 [2];
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_688 [16];
  long local_678;
  long local_670;
  long local_668;
  long local_660;
  long local_658;
  long local_650;
  long local_640;
  undefined1 local_638 [16];
  void *local_628;
  long local_620;
  void *local_618;
  long local_610;
  void *local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  Matrix<double,_3,_1,_0,_3,_1> local_5e8;
  Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> local_5d0;
  Matrix<double,_4,_4,_0,_4,_4> local_598;
  double local_518;
  void *local_510 [2];
  Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
  local_500;
  undefined1 local_4b8 [24];
  Matrix<double,_1,1,0,_1,1> *local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  double local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 local_460;
  double dStack_458;
  double local_450;
  double adStack_448 [2];
  Matrix<double,_4,_4,_0,_4,_4> local_438;
  undefined1 local_3b0 [24];
  long local_398;
  long local_388;
  long local_380;
  long local_378;
  long local_370;
  long local_360;
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  double local_338;
  double dStack_330;
  undefined1 *local_320;
  Matrix<double,_4,_4,_0,_4,_4> *local_318;
  Matrix<double,_4,_4,_0,_4,_4> local_308;
  IndexedMatrixArray local_288 [8];
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_280 [80];
  undefined1 local_230 [16];
  Index local_220;
  ios_base local_138 [264];
  
  bVar17 = 0;
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(local_288);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray((IndexedMatrixArray *)local_3b0);
  local_5e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       0.311236;
  local_5e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       -0.355773;
  local_5e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       1.1;
  local_230._0_8_ = (double *)0x6;
  local_220 = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_618,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_230);
  if (1 < local_610) {
    *(undefined8 *)((long)local_618 + 8) = 0x402399999999999a;
    local_230._0_8_ = (double *)0xf;
    local_220 = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_628,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)local_230);
    if (2 < local_620) {
      *(undefined8 *)((long)local_628 + 0x10) = 0x3ffccccccccccccd;
      uVar13 = 1;
      do {
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_230,
                   (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_618);
        stateObservation::IndexedMatrixArray::setValue(local_288,(Matrix *)local_230,uVar13);
        free((void *)local_230._0_8_);
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_230,
                   (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_628);
        stateObservation::IndexedMatrixArray::setValue
                  ((IndexedMatrixArray *)local_3b0,(Matrix *)local_230,uVar13);
        free((void *)local_230._0_8_);
        uVar13 = uVar13 + 1;
      } while (uVar13 != 0x1389);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_230,
                 (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_628);
      if ((local_378 - local_370 >> 3) * -0x5555555555555555 +
          ((local_360 - local_380 >> 3) + -1 + (ulong)(local_360 == 0)) * 0x15 ==
          (local_388 - local_398 >> 3) * 0x5555555555555555) {
        local_3b0._0_4_ = 0;
      }
      std::
      deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::push_back((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   *)(local_3b0 + 8),(value_type *)local_230);
      free((void *)local_230._0_8_);
      local_230._0_8_ = (double *)0x12;
      local_220 = 0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_510,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)local_230);
      local_608 = (void *)0x0;
      uStack_600 = 0;
      local_5f8 = 0;
      std::
      vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
      ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>const&>
                ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                  *)&local_608,(iterator)0x0,&local_5e8);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_230,
                 (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_510);
      stateObservation::examples::offlineEKFFlexibilityEstimation
                ((IndexedMatrixArray *)local_690,local_288,(Matrix *)local_3b0,(uint)local_230,
                 (vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)0x1,0.0,(IndexedMatrixArray *)&local_608,(IndexedMatrixArray *)0x0);
      free((void *)local_230._0_8_);
      std::ofstream::ofstream(local_230);
      std::ofstream::open(local_230,0x10d100);
      uVar13 = 0;
      if ((local_658 - local_650 >> 3) * -0x5555555555555555 +
          ((local_640 - local_660 >> 3) + -1 + (ulong)(local_640 == 0)) * 0x15 !=
          (local_668 - local_678 >> 3) * 0x5555555555555555) {
        uVar13 = local_690[0];
      }
      while( true ) {
        lVar12 = (local_668 - local_678 >> 3) * -0x5555555555555555 +
                 (local_658 - local_650 >> 3) * -0x5555555555555555 +
                 ((local_640 - local_660 >> 3) + -1 + (ulong)(local_640 == 0)) * 0x15;
        uVar3 = (local_690[0] - 1) + (int)lVar12;
        if (lVar12 == 0) {
          uVar3 = 0;
        }
        if (uVar3 < uVar13) {
          local_230._0_8_ = _VTT;
          *(undefined8 *)(local_230 + (long)_VTT[-3]) = _memcpy;
          std::filebuf::~filebuf((filebuf *)(local_230 + 8));
          std::ios_base::~ios_base(local_138);
          std::
          deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
          ::~deque(local_688);
          if (local_608 != (void *)0x0) {
            free(local_608);
          }
          free(local_510[0]);
          free(local_628);
          free(local_618);
          std::
          deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
          ::~deque((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)(local_3b0 + 8));
          std::
          deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
          ::~deque(local_280);
          return 0;
        }
        uVar9 = (ulong)uVar13;
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_230);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        lVar12 = (local_668 - local_678 >> 3) * -0x5555555555555555 +
                 (local_658 - local_650 >> 3) * -0x5555555555555555 +
                 ((local_640 - local_660 >> 3) + -1 + (ulong)(local_640 == 0)) * 0x15;
        if (lVar12 == 0) break;
        if ((uVar13 < local_690[0]) || (lVar12 + (ulong)local_690[0] <= uVar9)) break;
        uVar8 = (local_678 - local_670 >> 3) * -0x5555555555555555 + (ulong)(uVar13 - local_690[0]);
        if (uVar8 < 0x15) {
          local_4b8._0_8_ = local_678 + (ulong)(uVar13 - local_690[0]) * 0x18;
        }
        else {
          if ((long)uVar8 < 1) {
            uVar14 = ~(~uVar8 / 0x15);
          }
          else {
            uVar14 = uVar8 / 0x15;
          }
          local_4b8._0_8_ = uVar14 * -0x1f8 + *(long *)(local_660 + uVar14 * 8) + uVar8 * 0x18;
        }
        poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                           *)local_4b8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        local_6f8 = (PointerType)0x0;
        dStack_6f0 = 0.0;
        free((void *)0x0);
        pdVar5 = (PointerType)malloc(0x30);
        if (((ulong)pdVar5 & 0xf) != 0) {
          __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                        ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                        "void *Eigen::internal::aligned_malloc(std::size_t)");
        }
        if (pdVar5 == (PointerType)0x0) {
          puVar7 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar7 = acos;
          __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        dStack_6f0 = 2.96439387504748e-323;
        pdVar5[4] = 0.0;
        pdVar5[5] = 0.0;
        pdVar5[2] = 0.0;
        pdVar5[3] = 0.0;
        *pdVar5 = 0.0;
        pdVar5[1] = 0.0;
        lVar12 = (local_668 - local_678 >> 3) * -0x5555555555555555 +
                 (local_658 - local_650 >> 3) * -0x5555555555555555 +
                 ((local_640 - local_660 >> 3) + -1 + (ulong)(local_640 == 0)) * 0x15;
        local_6f8 = pdVar5;
        if (lVar12 == 0) break;
        if ((uVar13 < local_690[0]) || (lVar12 + (ulong)local_690[0] <= uVar9)) break;
        uVar8 = (local_678 - local_670 >> 3) * -0x5555555555555555 + (ulong)(uVar13 - local_690[0]);
        if (uVar8 < 0x15) {
          pMVar15 = (Matrix<double,__1,__1,_0,__1,__1> *)
                    (local_678 + (ulong)(uVar13 - local_690[0]) * 0x18);
        }
        else {
          if ((long)uVar8 < 1) {
            uVar14 = ~(~uVar8 / 0x15);
          }
          else {
            uVar14 = uVar8 / 0x15;
          }
          pMVar15 = (Matrix<double,__1,__1,_0,__1,__1> *)
                    (uVar14 * -0x1f8 + *(long *)(local_660 + uVar14 * 8) + uVar8 * 0x18);
        }
        Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((Matrix<double,_1,1,0,_1,1> *)&local_6d8,pMVar15);
        local_4b8._0_8_ =
             local_6d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[0];
        local_4b8._8_8_ = 3;
        uStack_498 = 0;
        local_488 = local_6d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[1];
        if ((long)local_6d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[1] < 3) {
LAB_0010710b:
          local_4a0 = (Matrix<double,_1,1,0,_1,1> *)&local_6d8;
          local_4b8._8_8_ = 3;
          local_6d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[1] = local_488;
          __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                        ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                        "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                       );
        }
        local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0] = (double)local_6f8;
        local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[1] = 1.48219693752374e-323;
        local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[3] = (double)&local_6f8;
        local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[4] = 0.0;
        local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[6] = dStack_6f0;
        if ((long)dStack_6f0 < 3) goto LAB_0010710b;
        local_4a0 = (Matrix<double,_1,1,0,_1,1> *)&local_6d8;
        Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_1>::
        operator=((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1> *)
                  &local_598,
                  (MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1> *)
                  local_4b8);
        free((void *)local_6d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[0]);
        lVar12 = (local_668 - local_678 >> 3) * -0x5555555555555555 +
                 (local_658 - local_650 >> 3) * -0x5555555555555555 +
                 ((local_640 - local_660 >> 3) + -1 + (ulong)(local_640 == 0)) * 0x15;
        if (lVar12 == 0) break;
        if ((uVar13 < local_690[0]) || (lVar12 + (ulong)local_690[0] <= uVar9)) break;
        uVar9 = (local_678 - local_670 >> 3) * -0x5555555555555555 + (ulong)(uVar13 - local_690[0]);
        if (uVar9 < 0x15) {
          pMVar15 = (Matrix<double,__1,__1,_0,__1,__1> *)
                    (local_678 + (ulong)(uVar13 - local_690[0]) * 0x18);
        }
        else {
          if ((long)uVar9 < 1) {
            uVar8 = ~(~uVar9 / 0x15);
          }
          else {
            uVar8 = uVar9 / 0x15;
          }
          pMVar15 = (Matrix<double,__1,__1,_0,__1,__1> *)
                    (uVar8 * -0x1f8 + *(long *)(local_660 + uVar8 * 8) + uVar9 * 0x18);
        }
        Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((Matrix<double,_1,1,0,_1,1> *)&local_6d8,pMVar15);
        local_4b8._0_8_ =
             (long)local_6d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[0] + 0x18;
        local_4b8._8_8_ = 3;
        uStack_498 = 3;
        local_488 = local_6d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[1];
        if ((long)local_6d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[1] < 6) goto LAB_0010710b;
        local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[4] = (double)((long)dStack_6f0 + -3);
        local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0] = (double)(local_6f8 + (long)dStack_6f0 + -3);
        local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[1] = 1.48219693752374e-323;
        local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[3] = (double)&local_6f8;
        local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[6] = dStack_6f0;
        if ((long)dStack_6f0 < 3) goto LAB_0010710b;
        local_4a0 = (Matrix<double,_1,1,0,_1,1> *)&local_6d8;
        Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_1>::
        operator=((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1> *)
                  &local_598,
                  (MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1> *)
                  local_4b8);
        free((void *)local_6d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[0]);
        if (dStack_6f0 != 2.96439387504748e-323) {
          __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                        ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                        "void Eigen::PlainObjectBase<Eigen::Matrix<double, 6, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 6, 1>]"
                       );
        }
        local_338 = *local_6f8;
        dStack_330 = local_6f8[1];
        local_6d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] = local_6f8[2];
        local_6d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] = *(double *)*(undefined1 (*) [16])(local_6f8 + 3);
        local_6d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] = local_6f8[4];
        local_638 = *(undefined1 (*) [16])(local_6f8 + 3);
        local_6d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[3] = local_6f8[5];
        local_4b8._0_8_ = (PointerType)0x3ff0000000000000;
        local_4a0 = (Matrix<double,_1,1,0,_1,1> *)0x0;
        uStack_498 = 0;
        local_4b8._8_8_ = 0;
        local_4b8._16_8_ = 0;
        local_490 = 0x3ff0000000000000;
        local_478 = 0;
        uStack_470 = 0;
        local_488 = 0.0;
        uStack_480 = 0;
        local_468 = 0x3ff0000000000000;
        local_450 = 0.0;
        adStack_448[0] = 0.0;
        local_460 = 0;
        dStack_458 = 0.0;
        adStack_448[1] = 1.0;
        dVar2 = local_6d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[3] *
                local_6d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[3] +
                local_6d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[2] *
                local_6d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[2] +
                local_6d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[1] *
                local_6d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[1];
        if (dVar2 <= 9.999999999999999e-33) {
          dVar2 = 0.0;
          uVar18 = 0;
          uVar19 = 0;
          local_638 = ZEXT816(0);
          local_6e0 = 1.0;
        }
        else {
          local_6e0 = local_6d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[3];
          if (dVar2 < 0.0) {
            dVar2 = sqrt(dVar2);
            uVar18 = extraout_XMM0_Dc;
            uVar19 = extraout_XMM0_Dd;
          }
          else {
            uVar18 = 0;
            uVar19 = 0;
            dVar2 = SQRT(dVar2);
          }
          auVar1._8_4_ = SUB84(dVar2,0);
          auVar1._0_8_ = dVar2;
          auVar1._12_4_ = (int)((ulong)dVar2 >> 0x20);
          local_638 = divpd(local_638,auVar1);
          local_6e0 = local_6e0 / dVar2;
        }
        local_358._8_4_ = uVar18;
        local_358._0_8_ = dVar2;
        local_358._12_4_ = uVar19;
        dVar2 = sin(dVar2);
        local_518 = local_6e0 * dVar2;
        local_348._8_4_ = SUB84(dVar2 * (double)local_638._8_8_,0);
        local_348._0_8_ = dVar2 * (double)local_638._0_8_;
        local_348._12_4_ = (int)((ulong)(dVar2 * (double)local_638._8_8_) >> 0x20);
        dVar2 = cos((double)local_358._0_8_);
        dVar20 = 1.0 - dVar2;
        dVar21 = dVar20 * (double)local_638._0_8_;
        local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[3] = (double)local_638._8_8_ * dVar21 - local_518;
        local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[1] = (double)local_638._8_8_ * dVar21 + local_518;
        local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[6] = (double)local_348._8_8_ + local_6e0 * dVar21;
        local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[2] = local_6e0 * dVar21 - (double)local_348._8_8_;
        dVar22 = local_6e0 * dVar20 * (double)local_638._8_8_;
        local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[7] = dVar22 - (double)local_348._0_8_;
        local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[5] = dVar22 + (double)local_348._0_8_;
        local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0] = (double)local_638._0_8_ * dVar21 + dVar2;
        local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[4] = dVar20 * (double)local_638._8_8_ * (double)local_638._8_8_ + dVar2;
        local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[8] = local_6e0 * dVar20 * local_6e0 + dVar2;
        lVar12 = 0x10;
        pdVar11 = local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array + 2;
        do {
          dVar2 = pdVar11[-1];
          *(double *)
           ((long)&local_500.m_rhs.
                   super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
                   .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>
                   .m_startCol.m_value + lVar12) =
               ((plain_array<double,_16,_0,_16> *)(pdVar11 + -2))->array[0];
          *(double *)
           ((long)&local_500.m_rhs.
                   super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
                   .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>
                   .m_outerStride + lVar12) = dVar2;
          *(double *)(local_4b8 + lVar12) = *pdVar11;
          lVar12 = lVar12 + 0x20;
          pdVar11 = pdVar11 + 3;
        } while (lVar12 != 0x70);
        dStack_458 = local_338;
        local_450 = dStack_330;
        adStack_448[0] =
             local_6d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[0];
        lVar12 = 0x10;
        pdVar11 = (double *)local_4b8;
        pMVar16 = &local_308;
        for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pMVar16->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0] = *pdVar11;
          pdVar11 = pdVar11 + (ulong)bVar17 * -2 + 1;
          pMVar16 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar16 + ((ulong)bVar17 * -2 + 1) * 8);
        }
        local_438.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0] = 1.0;
        local_438.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[3] = 0.0;
        local_438.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[4] = 0.0;
        local_438.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[1] = 0.0;
        local_438.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[2] = 0.0;
        local_438.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[5] = 1.0;
        local_438.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[8] = 0.0;
        local_438.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[9] = 0.0;
        local_438.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[6] = 0.0;
        local_438.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[7] = 0.0;
        local_438.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[10] = 1.0;
        local_438.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xd] = 0.0;
        local_438.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xe] = 0.0;
        local_438.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xb] = 0.0;
        local_438.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xc] = 0.0;
        local_438.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xf] = 1.0;
        local_6d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] = local_308.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0];
        local_6d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] = local_308.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[4];
        local_6d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] = local_308.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[8];
        local_6d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[3] = local_308.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[1];
        local_6d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[4] = local_308.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[5];
        local_6d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[5] = local_308.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[9];
        local_6d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6] = local_308.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[2];
        local_6d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7] = local_308.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[6];
        local_6d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8] = local_308.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[10];
        pdVar11 = local_6d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array + 2;
        do {
          dVar2 = pdVar11[-1];
          *(double *)((long)adStack_448 + lVar12) =
               ((plain_array<double,_9,_0,_0> *)(pdVar11 + -2))->array[0];
          *(double *)
           ((long)local_438.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array + lVar12 + -8) = dVar2;
          *(double *)
           ((long)local_438.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array + lVar12) = *pdVar11;
          lVar12 = lVar12 + 0x20;
          pdVar11 = pdVar11 + 3;
        } while (lVar12 != 0x70);
        local_500.m_lhs.m_xpr = &local_6d8;
        local_500.m_rhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
             local_308.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
             .array + 0xc;
        local_500.m_rhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.
        m_value = 3;
        local_500.m_rhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.
        m_value = 1;
        local_500.m_rhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_xpr =
             &local_308;
        local_500.m_rhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startRow.
        m_value = 0;
        local_500.m_rhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startCol.
        m_value = 3;
        local_500.m_rhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        m_outerStride = 4;
        local_5d0.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
             local_438.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
             .array + 0xc;
        local_5d0.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.
        m_value = 3;
        local_5d0.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.
        m_value = 1;
        local_5d0.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_xpr =
             &local_438;
        local_5d0.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startRow
        .m_value = 0;
        local_5d0.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startCol
        .m_value = 3;
        local_5d0.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        m_outerStride = 4;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,0>,Eigen::internal::assign_op<double,double>>
                  (&local_5d0,&local_500,&local_6f9,(type)0x0);
        local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0] = 1.0;
        local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[3] = 0.0;
        local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[4] = 0.0;
        local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[1] = 0.0;
        local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[2] = 0.0;
        local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[5] = 1.0;
        local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[8] = 0.0;
        local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[9] = 0.0;
        local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[6] = 0.0;
        local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[7] = 0.0;
        local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[10] = 1.0;
        local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xd] = 0.0;
        local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xe] = 0.0;
        local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xb] = 0.0;
        local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xc] = 0.0;
        local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xf] = 1.0;
        local_6d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] = local_438.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0];
        local_6d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] = local_438.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[4];
        local_6d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] = local_438.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[8];
        local_6d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[3] = local_438.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[1];
        local_6d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[4] = local_438.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[5];
        local_6d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[5] = local_438.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[9];
        local_6d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6] = local_438.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[2];
        local_6d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7] = local_438.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[6];
        local_6d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8] = local_438.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[10];
        lVar12 = 0x10;
        pdVar11 = local_6d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array + 2;
        do {
          dVar2 = pdVar11[-1];
          *(double *)
           ((long)local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array + lVar12 + -0x10) =
               ((plain_array<double,_9,_0,_0> *)(pdVar11 + -2))->array[0];
          *(double *)
           ((long)local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array + lVar12 + -8) = dVar2;
          *(double *)
           ((long)local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array + lVar12) = *pdVar11;
          lVar12 = lVar12 + 0x20;
          pdVar11 = pdVar11 + 3;
        } while (lVar12 != 0x70);
        local_500.m_lhs.m_xpr = &local_6d8;
        local_500.m_rhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
             local_438.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
             .array + 0xc;
        local_500.m_rhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.
        m_value = 3;
        local_500.m_rhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.
        m_value = 1;
        local_500.m_rhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_xpr =
             &local_438;
        local_500.m_rhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startRow.
        m_value = 0;
        local_500.m_rhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startCol.
        m_value = 3;
        local_500.m_rhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        m_outerStride = 4;
        local_5d0.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
             local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
             .array + 0xc;
        local_5d0.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.
        m_value = 3;
        local_5d0.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.
        m_value = 1;
        local_5d0.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_xpr =
             &local_598;
        local_5d0.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startRow
        .m_value = 0;
        local_5d0.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startCol
        .m_value = 3;
        local_5d0.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        m_outerStride = 4;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,0>,Eigen::internal::assign_op<double,double>>
                  (&local_5d0,&local_500,&local_6f9,(type)0x0);
        local_320 = local_4b8;
        local_318 = &local_598;
        poVar4 = Eigen::operator<<((ostream *)&std::cout,
                                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                                    *)&local_320);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        plVar6 = (long *)std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
        std::ostream::put((char)plVar6);
        std::ostream::flush();
        free(local_6f8);
        uVar13 = uVar13 + 1;
      }
      __assert_fail("checkIndex(time) && \"Error: Time out of range\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/tools/definitions.hxx"
                    ,0x9b,"void stateObservation::IndexedMatrixArray::check_(unsigned int) const");
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x19a,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

int testConstant()
{
    /// The number of samples
    const unsigned kmax=5000;

    ///sampling period
    const double dt=1e-3;

    ///Sizes of the states for the state, the measurement, and the input vector
    const unsigned stateSize=18;
    const unsigned measurementSize=6;
    const unsigned inputSize=15;

    ///The array containing all the states, the measurements and the inputs
    IndexedMatrixArray y;
    IndexedMatrixArray u;

    Vector3 contact(Vector3::Zero());

    contact[0]=0.31123600000000001;
    contact[1]=-0.35577300000000001;
    contact[2]=1.1000000000000001;

    Vector yConstant = Vector::Zero(measurementSize,1);
    yConstant[1]=9.8;



    Vector uConstant = Vector::Zero(inputSize,1);
    uConstant[2]=1.8;

    {
        for ( unsigned i=1 ; i<kmax+1 ; ++i )
        {
            y.setValue(yConstant,i);
            u.setValue(uConstant,i);
        }
    }

    u.pushBack(uConstant);

    ///the initalization of a random estimation of the initial state
    Vector xh0=Vector::Zero(stateSize,1);

    std::vector<Vector3, Eigen::aligned_allocator<Vector3> > contactPositions;

    contactPositions.push_back(contact);

    stateObservation::IndexedMatrixArray xh=
        stateObservation::examples::offlineEKFFlexibilityEstimation
        (y,u,xh0,1,contactPositions,dt);

    ///file of output
    std::ofstream f;
    f.open("trajectory.dat");

    ///the reconstruction of the state
    for (unsigned i=xh.getFirstIndex();i<=xh.getLastIndex();++i)
    {
       f << i<<" "<< xh[i].transpose()
          << std::endl;

       Vector v2 (Matrix::Zero(6,1));

       v2.head(3) = Vector(xh[i]).segment(kine::pos,3);
       v2.tail(3) = Vector(xh[i]).segment(kine::ori,3);

       Matrix4 m= kine::vector6ToHomogeneousMatrix(v2);
       Vector4 v;
       v.head(3)=contact;
       v[3]=1;

       std::cout << m - kine::invertHomoMatrix(
                            kine::invertHomoMatrix(m))
                                        << std::endl << std::endl;

    }

    return 0;
}